

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O2

int __thiscall
Signal<std::shared_ptr<Transcript>_>::ConnectMember<Model>
          (Signal<std::shared_ptr<Transcript>_> *this,Model *inst,offset_in_Model_to_subr func)

{
  int iVar1;
  function<void_(std::shared_ptr<Transcript>)> fStack_48;
  anon_class_24_2_3f47e9d7 local_28;
  
  local_28.inst = inst;
  local_28.func = func;
  std::function<void(std::shared_ptr<Transcript>)>::
  function<Signal<std::shared_ptr<Transcript>>::ConnectMember<Model>(Model*,void(Model::*)(std::shared_ptr<Transcript>))::_lambda(std::shared_ptr<Transcript>)_1_,void>
            ((function<void(std::shared_ptr<Transcript>)> *)&fStack_48,&local_28);
  iVar1 = Connect(this,&fStack_48);
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }